

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void __thiscall cmFortranParser_s::~cmFortranParser_s(cmFortranParser_s *this)

{
  cmFortranParser_s *this_local;
  
  cmFortran_yylex_destroy(this->Scanner);
  std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::~stack(&this->SkipToEnd);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->PPDefinitions);
  std::__cxx11::string::~string((string *)&this->Error);
  std::__cxx11::string::~string((string *)&this->TokenString);
  std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::~stack
            (&this->FileStack);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->IncludePath);
  cmFortranCompiler::~cmFortranCompiler(&this->Compiler);
  return;
}

Assistant:

cmFortranParser_s::~cmFortranParser_s()
{
  cmFortran_yylex_destroy(this->Scanner);
}